

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

cupdlp_int
cupdlp_axpy(CUPDLPwork *w,cupdlp_int n,cupdlp_float *alpha,cupdlp_float *x,cupdlp_float *y)

{
  double dVar1;
  ulong uVar2;
  
  if (0 < n) {
    dVar1 = *alpha;
    uVar2 = 0;
    do {
      y[uVar2] = x[uVar2] * dVar1 + y[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return 0;
}

Assistant:

void AddToVector(cupdlp_float *x, const cupdlp_float weight,
                 const cupdlp_float *y, const cupdlp_int n) {
#ifdef USE_MY_BLAS

  for (int i = 0; i < n; ++i) {
    x[i] += weight * y[i];
  }

#else
  return ddot(n, x, incx, y, incy);
#endif
}